

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_proxy.cpp
# Opt level: O2

void __thiscall TcpProxy::handleConnectRequest(TcpProxy *this,Connection *conn)

{
  Buffer *this_00;
  element_type *this_01;
  off_t oVar1;
  char *pcVar2;
  Logger *pLVar3;
  char *pcVar4;
  pointer ptVar5;
  double __x;
  double __x_00;
  shared_ptr<Liby::TcpClient> tcpClient;
  ProxyContext context;
  _Any_data local_100 [2];
  shared_ptr<Liby::Connection> local_e0;
  undefined1 local_d0 [32];
  pointer local_b0;
  string service;
  string host;
  char address [50];
  
  this_00 = &conn->readBuf_;
  oVar1 = Liby::Buffer::size(this_00);
  if (8 < oVar1) {
    pcVar2 = Liby::Buffer::data(this_00);
    if (pcVar2[1] != '\x01' || *pcVar2 != '\x04') {
      pLVar3 = Liby::Logger::getLogger();
      Liby::Logger::log(pLVar3,__x);
      Liby::Connection::destroy(conn);
      return;
    }
    pcVar4 = inet_ntop(2,pcVar2 + 4,address,0x32);
    if (pcVar4 == (char *)0x0) {
      Liby::Connection::destroy(conn);
    }
    else {
      std::__cxx11::string::string((string *)&host,address,(allocator *)local_d0);
      std::__cxx11::to_string
                (&service,(uint)(ushort)(*(ushort *)(pcVar2 + 2) << 8 | *(ushort *)(pcVar2 + 2) >> 8
                                        ));
      pLVar3 = Liby::Logger::getLogger();
      Liby::Logger::log(pLVar3,__x_00);
      Liby::Buffer::retrieve(this_00);
      Liby::EventLoopGroup::creatTcpClient
                ((EventLoopGroup *)&tcpClient,(string *)this->group_,&host);
      this_01 = tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_100[0]._M_unused._M_member_pointer = (pointer)0x8;
      local_100[0]._8_8_ = 0;
      std::__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2> *)&context,
                 &tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>);
      std::function<void()>::
      function<TcpProxy::handleConnectRequest(Liby::Connection&)::_lambda()_1_,void>
                ((function<void()> *)local_d0,(anon_class_16_1_0de0f9ac *)&context);
      ptVar5 = (pointer)Liby::TimerMixin::runAfter
                                  (&this_01->super_TimerMixin,(Timestamp *)local_100,
                                   (BasicHandler *)local_d0);
      std::_Function_base::~_Function_base((_Function_base *)local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&context.weak_conn);
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Liby::Connection,void>
                ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)&local_e0,
                 (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
                 &conn->super_enable_shared_from_this<Liby::Connection>);
      ProxyContext::ProxyContext(&context,&local_e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_e0.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_d0._0_8_ = this;
      ProxyContext::ProxyContext((ProxyContext *)(local_d0 + 8),&context);
      local_b0 = ptVar5;
      std::function<void(std::shared_ptr<Liby::Connection>)>::
      function<TcpProxy::handleConnectRequest(Liby::Connection&)::_lambda(std::shared_ptr<Liby::Connection>)_1_,void>
                ((function<void(std::shared_ptr<Liby::Connection>)> *)local_100[0]._M_pod_data,
                 (anon_class_40_3_155447e0 *)local_d0);
      Liby::TcpClient::onConnect
                (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (Connector *)local_100);
      std::_Function_base::~_Function_base((_Function_base *)local_100);
      ProxyContext::~ProxyContext((ProxyContext *)(local_d0 + 8));
      ProxyContext::~ProxyContext(&context);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&service);
      std::__cxx11::string::~string((string *)&host);
    }
  }
  return;
}

Assistant:

void handleConnectRequest(Connection &conn) {
        Buffer &readBuf = conn.read();
        if (readBuf.size() < 9) {
            return;
        }

        char *base = readBuf.data();

        char ver = base[0];
        char command = base[1];

        if (ver != 4 || command != 1) {
            error("bad version %d or command %d", ver, command);
            conn.destroy();
            return;
        }

        char address[50];
        if (::inet_ntop(AF_INET, base + 4, address, 50) == nullptr) {
            conn.destroy();
            return;
        }

        string host = address;
        string service = to_string(ntohs(*(uint16_t *)(base + 2)));

        info("host: %s service: %s", host.data(), service.data());
        readBuf.retrieve();

        shared_ptr<TcpClient> tcpClient = group_.creatTcpClient(host, service);
        TimerId id = tcpClient->runAfter(Timestamp(8, 0), [tcpClient] {});

        ProxyContext context = conn.shared_from_this();
        tcpClient->onConnect([this, context, id](shared_ptr<Connection> c) {
            if (c && !context.weak_conn.expired()) {
                ProxyContext context1 = c;
                c->context_ = make_shared<ProxyContext>(context);
                auto c1 = context.weak_conn.lock();
                c1->context_ = make_shared<ProxyContext>(context1);

                c->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c1->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c1->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c->enableRead();
                c1->enableRead();

                char response[8];
                response[0] = 0x0;
                response[1] = 0x5A;
                c1->send(response, 8);

                return;
            }

            if (c) {
                c->destroy();
            }

            if (!context.weak_conn.expired()) {
                context.weak_conn.lock()->destroy();
            }
        });
    }